

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFUnitVector::addUnitsForSection
          (DWARFUnitVector *this,DWARFContext *C,DWARFSection *Section,DWARFSectionKind SectionKind)

{
  StringRef SS;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DWARFObject *Obj;
  DWARFDebugAbbrev *DA;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t extraout_RDX;
  DWARFObject *D;
  DWARFSectionKind SectionKind_local;
  DWARFSection *Section_local;
  DWARFContext *C_local;
  DWARFUnitVector *this_local;
  
  Obj = DWARFContext::getDWARFObj(C);
  DA = DWARFContext::getDebugAbbrev(C);
  iVar1 = (*Obj->_vptr_DWARFObject[0x12])();
  iVar2 = (*Obj->_vptr_DWARFObject[10])();
  iVar3 = (*Obj->_vptr_DWARFObject[0x11])();
  SS.Data._4_4_ = extraout_var_01;
  SS.Data._0_4_ = iVar3;
  iVar3 = (*Obj->_vptr_DWARFObject[0x19])();
  iVar4 = (*Obj->_vptr_DWARFObject[0x23])();
  iVar5 = (*Obj->_vptr_DWARFObject[0xf])();
  iVar6 = (*Obj->_vptr_DWARFObject[5])();
  SS.Length = extraout_RDX;
  addUnitsImpl(this,C,Obj,Section,DA,(DWARFSection *)CONCAT44(extraout_var,iVar1),
               (DWARFSection *)CONCAT44(extraout_var_00,iVar2),SS,
               (DWARFSection *)CONCAT44(extraout_var_02,iVar3),
               (DWARFSection *)CONCAT44(extraout_var_03,iVar4),
               (DWARFSection *)CONCAT44(extraout_var_04,iVar5),(bool)((byte)iVar6 & 1),false,false,
               SectionKind);
  return;
}

Assistant:

void DWARFUnitVector::addUnitsForSection(DWARFContext &C,
                                         const DWARFSection &Section,
                                         DWARFSectionKind SectionKind) {
  const DWARFObject &D = C.getDWARFObj();
  addUnitsImpl(C, D, Section, C.getDebugAbbrev(), &D.getRangesSection(),
               &D.getLocSection(), D.getStrSection(),
               D.getStrOffsetsSection(), &D.getAddrSection(),
               D.getLineSection(), D.isLittleEndian(), false, false,
               SectionKind);
}